

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O0

void PrintFinalStats(void *cvode_mem)

{
  undefined8 in_RDI;
  long nfeLS;
  long nje;
  long ncfn;
  long nni;
  long netf;
  long nsetups;
  long nfe;
  long nst;
  int retval;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_c = CVodeGetNumSteps(in_RDI,&local_18);
  check_retval(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_c = CVodeGetNumRhsEvals(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_c = CVodeGetNumLinSolvSetups(local_8,&local_28);
  check_retval(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_c = CVodeGetNumErrTestFails(local_8,&local_30);
  check_retval(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_c = CVodeGetNumNonlinSolvIters(local_8,&local_38);
  check_retval(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_c = CVodeGetNumNonlinSolvConvFails(local_8,&local_40);
  check_retval(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_c = CVodeGetNumJacEvals(local_8,&local_48);
  check_retval(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_c = CVodeGetNumLinRhsEvals(local_8,&stack0xffffffffffffffb0);
  check_retval(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe  = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",local_18,local_20,
         local_28,CONCAT44(uStack_4c,in_stack_ffffffffffffffb0),local_48);
  printf("nni = %-6ld ncfn = %-6ld netf = %ld\n",local_38,local_40,local_30);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem)
{
  int retval;
  long int nst, nfe, nsetups, netf, nni, ncfn, nje, nfeLS;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(retval, "CVodeGetNumSteps");
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(retval, "CVodeGetNumRhsEvals");
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(retval, "CVodeGetNumLinSolvSetups");
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(retval, "CVodeGetNumErrTestFails");
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(retval, "CVodeGetNumNonlinSolvIters");
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(retval, "CVodeGetNumNonlinSolvConvFails");

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(retval, "CVodeGetNumJacEvals");
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(retval, "CVodeGetNumLinRhsEvals");

  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe  = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",
         nst, nfe, nsetups, nfeLS, nje);
  printf("nni = %-6ld ncfn = %-6ld netf = %ld\n", nni, ncfn, netf);

  return;
}